

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_serial.c
# Opt level: O1

mm_serial_context_t * open_serial(char *modem_dev,FILE *logstream,FILE *bytestream)

{
  int iVar1;
  uint uVar2;
  mm_serial_context_t *pmVar3;
  int *__ptr;
  
  iVar1 = -1;
  if (bytestream == (FILE *)0x0) {
    iVar1 = platform_open_serial(modem_dev);
  }
  __ptr = (int *)0x1;
  pmVar3 = (mm_serial_context_t *)calloc(1,0x18);
  if (pmVar3 != (mm_serial_context_t *)0x0) {
    pmVar3->fd = iVar1;
    pmVar3->logstream = logstream;
    pmVar3->bytestream = bytestream;
    return pmVar3;
  }
  open_serial_cold_1();
  if (__ptr != (int *)0x0) {
    uVar2 = platform_close_serial(*__ptr);
    free(__ptr);
    return (mm_serial_context_t *)(ulong)uVar2;
  }
  return (mm_serial_context_t *)0xffffffff;
}

Assistant:

mm_serial_context_t* open_serial(const char *modem_dev, FILE *logstream, FILE *bytestream) {
    int fd = -1;
    mm_serial_context_t *pserial_context;

    if (bytestream == NULL) {
        fd = platform_open_serial(modem_dev);
    }

    pserial_context = (mm_serial_context_t *)calloc(1, sizeof(mm_serial_context_t));

    if (pserial_context == NULL) {
        fprintf(stderr, "%s: Error allocating memory.\n", __func__);
        exit(-ENOMEM);
    }

    pserial_context->fd = fd;
    pserial_context->logstream  = logstream;
    pserial_context->bytestream = bytestream;

    return pserial_context;
}